

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  CompareOp op;
  cmMakefile *pcVar1;
  static_string_view key_1;
  static_string_view key_1_00;
  static_string_view key_1_01;
  CurrentAndTwoMoreIter args_00;
  CurrentAndTwoMoreIter args_01;
  CurrentAndTwoMoreIter args_02;
  CurrentAndTwoMoreIter args_03;
  CurrentAndTwoMoreIter args_04;
  static_string_view key_2;
  static_string_view key_2_00;
  static_string_view key_2_01;
  static_string_view key_3;
  static_string_view key_3_00;
  static_string_view key_3_01;
  double dVar2;
  iterator iVar3;
  bool bVar4;
  bool value;
  int iVar5;
  int iVar6;
  cmValue cVar7;
  string *psVar8;
  cmValue cVar9;
  ostream *poVar10;
  string *f2;
  Status SVar11;
  PolicyID id;
  PolicyID id_00;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  static_string_view keyword_02;
  static_string_view keyword_03;
  string_view arg;
  string_view str;
  static_string_view current;
  static_string_view current_00;
  static_string_view current_01;
  static_string_view key;
  static_string_view key_00;
  static_string_view key_01;
  CurrentAndTwoMoreIter args;
  string def_buf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  RegularExpression regEntry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ostringstream error;
  undefined4 uStack_1c4;
  string local_50 [32];
  
  cmArgumentList::CurrentAndTwoMoreIter::CurrentAndTwoMoreIter
            (&args,&newArgs->
                    super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            );
  while( true ) {
    iVar3._M_node = args.current._M_node;
    if (args.current._M_node == (_List_node_base *)newArgs) break;
    if ((args.next._M_node == (_List_node_base *)newArgs) ||
       (keyword.super_string_view._M_str = DAT_0086bac0,
       keyword.super_string_view._M_len = (anonymous_namespace)::keyMATCHES,
       bVar4 = IsKeyword(this,keyword,(cmExpandedCommandArgument *)(args.current._M_node + 1)),
       !bVar4)) {
      if ((args.next._M_node != (_List_node_base *)newArgs) &&
         (args.nextnext._M_node != (_List_node_base *)newArgs)) {
        keyword_00.super_string_view._M_str = DAT_0086bac0;
        keyword_00.super_string_view._M_len = (anonymous_namespace)::keyMATCHES;
        bVar4 = IsKeyword(this,keyword_00,(cmExpandedCommandArgument *)(args.next._M_node + 1));
        if (bVar4) {
          cVar7 = GetDefinitionIfUnquoted
                            (this,(cmExpandedCommandArgument *)(args.current._M_node + 1));
          def_buf._M_dataplus._M_p = (pointer)&def_buf.field_2;
          def_buf._M_string_length = 0;
          def_buf.field_2._M_local_buf[0] = '\0';
          if (cVar7.Value == (string *)0x0) {
            cVar7.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                    ((cmExpandedCommandArgument *)(args.current._M_node + 1));
          }
          else {
            psVar8 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                               ((cmExpandedCommandArgument *)(args.current._M_node + 1));
            str._M_str = (psVar8->_M_dataplus)._M_p;
            str._M_len = psVar8->_M_string_length;
            bVar4 = cmHasLiteralPrefix<13ul>(str,(char (*) [13])"CMAKE_MATCH_");
            if (bVar4) {
              cVar7.Value = &def_buf;
              std::__cxx11::string::_M_assign((string *)cVar7.Value);
            }
          }
          cmMakefile::ClearMatches(this->Makefile);
          psVar8 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                             ((cmExpandedCommandArgument *)(args.nextnext._M_node + 1));
          regEntry.regmust = (char *)0x0;
          regEntry.program = (char *)0x0;
          regEntry.progsize = 0;
          memset(&regEntry,0,0xaa);
          bVar4 = cmsys::RegularExpression::compile(&regEntry,psVar8);
          if (bVar4) {
            value = cmsys::RegularExpression::find(&regEntry,cVar7.Value);
            if (value) {
              cmMakefile::StoreMatches(this->Makefile,&regEntry);
            }
            args_01.next._M_node = args.next._M_node;
            args_01.current._M_node = args.current._M_node;
            args_01.nextnext._M_node = args.nextnext._M_node;
            cmArgumentList::ReduceTwoArgs(newArgs,value,args_01);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
            poVar10 = std::operator<<((ostream *)&error,"Regular expression \"");
            poVar10 = std::operator<<(poVar10,(string *)psVar8);
            std::operator<<(poVar10,"\" cannot compile");
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)errorString,local_50);
            std::__cxx11::string::~string(local_50);
            *status = FATAL_ERROR;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
          }
          cmsys::RegularExpression::~RegularExpression(&regEntry);
          std::__cxx11::string::~string((string *)&def_buf);
          if (!bVar4) break;
        }
        else {
          key_1.super_string_view._M_str = (char *)(anonymous_namespace)::keyGREATER._8_8_;
          key_1.super_string_view._M_len = (anonymous_namespace)::keyGREATER._0_8_;
          key_2.super_string_view._M_str = (char *)(anonymous_namespace)::keyGREATER_EQUAL._8_8_;
          key_2.super_string_view._M_len = (anonymous_namespace)::keyGREATER_EQUAL._0_8_;
          key_3.super_string_view._M_str = (char *)(anonymous_namespace)::keyEQUAL._8_8_;
          key_3.super_string_view._M_len = (anonymous_namespace)::keyEQUAL._0_8_;
          current.super_string_view._M_str = DAT_0086baa0;
          current.super_string_view._M_len = (anonymous_namespace)::keyLESS;
          key.super_string_view._M_str = DAT_0086bab0;
          key.super_string_view._M_len = (anonymous_namespace)::keyLESS_EQUAL;
          iVar5 = matchKeysImpl<1,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view>
                            (this,(cmExpandedCommandArgument *)(args.next._M_node + 1),current,key,
                             key_1,key_2,key_3);
          if (iVar5 == 0) {
            key_1_00.super_string_view._M_str = (char *)(anonymous_namespace)::keySTRGREATER._8_8_;
            key_1_00.super_string_view._M_len = (anonymous_namespace)::keySTRGREATER._0_8_;
            key_2_00.super_string_view._M_str =
                 (char *)(anonymous_namespace)::keySTRGREATER_EQUAL._8_8_;
            key_2_00.super_string_view._M_len = (anonymous_namespace)::keySTRGREATER_EQUAL._0_8_;
            key_3_00.super_string_view._M_str = (char *)(anonymous_namespace)::keySTREQUAL._8_8_;
            key_3_00.super_string_view._M_len = (anonymous_namespace)::keySTREQUAL._0_8_;
            current_00.super_string_view._M_str = DAT_0086bb50;
            current_00.super_string_view._M_len = (anonymous_namespace)::keySTRLESS;
            key_00.super_string_view._M_str = DAT_0086bb60;
            key_00.super_string_view._M_len = (anonymous_namespace)::keySTRLESS_EQUAL;
            iVar5 = matchKeysImpl<1,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view>
                              (this,(cmExpandedCommandArgument *)(args.next._M_node + 1),current_00,
                               key_00,key_1_00,key_2_00,key_3_00);
            if (iVar5 == 0) {
              key_1_01.super_string_view._M_str =
                   (char *)(anonymous_namespace)::keyVERSION_GREATER._8_8_;
              key_1_01.super_string_view._M_len = (anonymous_namespace)::keyVERSION_GREATER._0_8_;
              key_2_01.super_string_view._M_str =
                   (char *)(anonymous_namespace)::keyVERSION_GREATER_EQUAL._8_8_;
              key_2_01.super_string_view._M_len =
                   (anonymous_namespace)::keyVERSION_GREATER_EQUAL._0_8_;
              key_3_01.super_string_view._M_str =
                   (char *)(anonymous_namespace)::keyVERSION_EQUAL._8_8_;
              key_3_01.super_string_view._M_len = (anonymous_namespace)::keyVERSION_EQUAL._0_8_;
              current_01.super_string_view._M_str = DAT_0086bbc0;
              current_01.super_string_view._M_len = (anonymous_namespace)::keyVERSION_LESS;
              key_01.super_string_view._M_str = DAT_0086bbd0;
              key_01.super_string_view._M_len = (anonymous_namespace)::keyVERSION_LESS_EQUAL;
              iVar5 = matchKeysImpl<1,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view>
                                (this,(cmExpandedCommandArgument *)(args.next._M_node + 1),
                                 current_01,key_01,key_1_01,key_2_01,key_3_01);
              if (iVar5 == 0) {
                keyword_01.super_string_view._M_str = DAT_0086ba80;
                keyword_01.super_string_view._M_len = (anonymous_namespace)::keyIS_NEWER_THAN;
                bVar4 = IsKeyword(this,keyword_01,
                                  (cmExpandedCommandArgument *)(args.next._M_node + 1));
                if (!bVar4) {
                  keyword_02.super_string_view._M_str = DAT_0086ba50;
                  keyword_02.super_string_view._M_len = (anonymous_namespace)::keyIN_LIST;
                  bVar4 = IsKeyword(this,keyword_02,
                                    (cmExpandedCommandArgument *)(args.next._M_node + 1));
                  if (bVar4) {
                    if (this->Policy57Status < NEW) {
                      if (this->Policy57Status == WARN) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
                        cmPolicies::GetPolicyWarning_abi_cxx11_
                                  ((string *)&regEntry,(cmPolicies *)0x39,id);
                        poVar10 = std::operator<<((ostream *)&error,(string *)&regEntry);
                        std::operator<<(poVar10,
                                        "\nIN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                                       );
                        std::__cxx11::string::~string((string *)&regEntry);
                        pcVar1 = this->Makefile;
                        std::__cxx11::stringbuf::str();
                        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&regEntry);
LAB_0043acaf:
                        std::__cxx11::string::~string((string *)&regEntry);
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
                      }
                    }
                    else {
                      cVar7 = GetVariableOrString(this,(cmExpandedCommandArgument *)
                                                       (args.current._M_node + 1));
                      pcVar1 = this->Makefile;
                      psVar8 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                         ((cmExpandedCommandArgument *)(args.nextnext._M_node + 1));
                      cVar9 = cmMakefile::GetDefinition(pcVar1,psVar8);
                      if (cVar9.Value == (string *)0x0) {
                        bVar4 = false;
                      }
                      else {
                        arg._M_str = ((cVar9.Value)->_M_dataplus)._M_p;
                        arg._M_len = (cVar9.Value)->_M_string_length;
                        cmExpandedList_abi_cxx11_(&local_2f0,arg,true);
                        bVar4 = ::cm::
                                contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                          (&local_2f0,cVar7.Value);
                      }
                      args_04.next._M_node = args.next._M_node;
                      args_04.current._M_node = args.current._M_node;
                      args_04.nextnext._M_node = args.nextnext._M_node;
                      cmArgumentList::ReduceTwoArgs(newArgs,bVar4,args_04);
                      if (cVar9.Value != (string *)0x0) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector(&local_2f0);
                      }
                    }
                  }
                  else {
                    keyword_03.super_string_view._M_str = DAT_0086bbe0;
                    keyword_03.super_string_view._M_len = (anonymous_namespace)::keyPATH_EQUAL;
                    bVar4 = IsKeyword(this,keyword_03,
                                      (cmExpandedCommandArgument *)(args.next._M_node + 1));
                    if (bVar4) {
                      if (WARN < this->Policy139Status) {
                        cVar7 = GetVariableOrString(this,(cmExpandedCommandArgument *)
                                                         (args.current._M_node + 1));
                        cVar9 = GetVariableOrString(this,(cmExpandedCommandArgument *)
                                                         (args.nextnext._M_node + 1));
                        std::__cxx11::string::string((string *)&local_2d8,(string *)cVar7.Value);
                        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                                  ((cmCMakePath *)&error,&local_2d8,generic_format);
                        std::__cxx11::string::string((string *)&local_1e8,(string *)cVar9.Value);
                        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                                  ((cmCMakePath *)&regEntry,&local_1e8,generic_format);
                        bVar4 = ::operator==((cmCMakePath *)&error,(cmCMakePath *)&regEntry);
                        std::filesystem::__cxx11::path::~path((path *)&regEntry);
                        std::__cxx11::string::~string((string *)&local_1e8);
                        std::filesystem::__cxx11::path::~path((path *)&error);
                        std::__cxx11::string::~string((string *)&local_2d8);
                        goto LAB_0043ab20;
                      }
                      if (this->Policy139Status == WARN) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
                        cmPolicies::GetPolicyWarning_abi_cxx11_
                                  ((string *)&regEntry,(cmPolicies *)0x8b,id_00);
                        poVar10 = std::operator<<((ostream *)&error,(string *)&regEntry);
                        std::operator<<(poVar10,
                                        "\nPATH_EQUAL will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                                       );
                        std::__cxx11::string::~string((string *)&regEntry);
                        pcVar1 = this->Makefile;
                        std::__cxx11::stringbuf::str();
                        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&regEntry);
                        goto LAB_0043acaf;
                      }
                    }
                  }
                  goto LAB_0043ac0c;
                }
                _error = 0;
                psVar8 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                   ((cmExpandedCommandArgument *)(args.current._M_node + 1));
                f2 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                               ((cmExpandedCommandArgument *)(args.nextnext._M_node + 1));
                SVar11 = cmsys::SystemTools::FileTimeCompare(psVar8,f2,(int *)&error);
                bVar4 = _error < 2 || SVar11.Kind_ != Success;
              }
              else {
                op = *(CompareOp *)
                      (
                      "\nPATH_EQUAL will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                      + (long)iVar5 * 4 + 0x88);
                cVar7 = GetVariableOrString(this,(cmExpandedCommandArgument *)
                                                 (args.current._M_node + 1));
                cVar9 = GetVariableOrString(this,(cmExpandedCommandArgument *)
                                                 (args.nextnext._M_node + 1));
                bVar4 = cmSystemTools::VersionCompare(op,cVar7.Value,cVar9.Value);
              }
            }
            else {
              cVar7 = GetVariableOrString(this,(cmExpandedCommandArgument *)
                                               (args.current._M_node + 1));
              GetVariableOrString(this,(cmExpandedCommandArgument *)(args.nextnext._M_node + 1));
              iVar6 = std::__cxx11::string::compare((string *)cVar7.Value);
              if (iVar5 == 3) {
                bVar4 = 0 < iVar6;
              }
              else if (iVar5 == 2) {
                bVar4 = iVar6 < 1;
              }
              else if (iVar5 == 1) {
                bVar4 = SUB41((uint)iVar6 >> 0x1f,0);
              }
              else if (iVar5 == 4) {
                bVar4 = -1 < iVar6;
              }
              else {
                bVar4 = iVar5 == 5 && iVar6 == 0;
              }
            }
LAB_0043ab20:
            args_02.next._M_node = args.next._M_node;
            args_02.current._M_node = args.current._M_node;
            args_02.nextnext._M_node = args.nextnext._M_node;
            cmArgumentList::ReduceTwoArgs(newArgs,bVar4,args_02);
          }
          else {
            cVar7 = GetVariableOrString(this,(cmExpandedCommandArgument *)(args.current._M_node + 1)
                                       );
            cVar9 = GetVariableOrString(this,(cmExpandedCommandArgument *)
                                             (args.nextnext._M_node + 1));
            bVar4 = false;
            iVar6 = __isoc99_sscanf(((cVar7.Value)->_M_dataplus)._M_p,"%lg",(ostringstream *)&error)
            ;
            if (iVar6 == 1) {
              bVar4 = false;
              iVar6 = __isoc99_sscanf(((cVar9.Value)->_M_dataplus)._M_p,"%lg",&regEntry);
              if (iVar6 == 1) {
                dVar2 = (double)CONCAT44(uStack_1c4,_error);
                if (iVar5 == 3) {
                  bVar4 = dVar2 < (double)regEntry.regmatch.startp[0];
LAB_0043aae0:
                  bVar4 = !bVar4 && (double)regEntry.regmatch.startp[0] != dVar2;
                }
                else {
                  if (iVar5 == 2) {
                    bVar4 = (double)regEntry.regmatch.startp[0] < dVar2;
                  }
                  else {
                    if (iVar5 == 1) {
                      bVar4 = (double)regEntry.regmatch.startp[0] < dVar2;
                      goto LAB_0043aae0;
                    }
                    if (iVar5 != 4) {
                      bVar4 = dVar2 == (double)regEntry.regmatch.startp[0] && iVar5 == 5;
                      goto LAB_0043abdd;
                    }
                    bVar4 = dVar2 < (double)regEntry.regmatch.startp[0];
                  }
                  bVar4 = !bVar4;
                }
              }
            }
LAB_0043abdd:
            args_03.next._M_node = args.next._M_node;
            args_03.current._M_node = args.current._M_node;
            args_03.nextnext._M_node = args.nextnext._M_node;
            cmArgumentList::ReduceTwoArgs(newArgs,bVar4,args_03);
          }
        }
      }
    }
    else {
      args_00.next._M_node = args.next._M_node;
      args_00.current._M_node = args.current._M_node;
      args_00.nextnext._M_node = args.nextnext._M_node;
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndTwoMoreIter>
                (newArgs,false,args_00);
    }
LAB_0043ac0c:
    cmArgumentList::CurrentAndTwoMoreIter::advance
              ((CurrentAndTwoMoreIter *)&error,&args,
               &newArgs->
                super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
  }
  return iVar3._M_node == (_List_node_base *)newArgs;
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make3ArgsIterator(); args.current != newArgs.end();
       args.advance(newArgs)) {

    int matchNo;

    // NOTE Handle special case `if(... BLAH_BLAH MATCHES)`
    // (i.e., w/o regex to match which is possibly result of
    // variable expansion to an empty string)
    if (args.next != newArgs.end() &&
        this->IsKeyword(keyMATCHES, *args.current)) {
      newArgs.ReduceOneArg(false, args);
    }

    // NOTE Fail fast: All the binary ops below require 2 arguments.
    else if (args.next == newArgs.end() || args.nextnext == newArgs.end()) {
      continue;
    }

    else if (this->IsKeyword(keyMATCHES, *args.next)) {
      cmValue def = this->GetDefinitionIfUnquoted(*args.current);

      std::string def_buf;
      if (!def) {
        def = cmValue(args.current->GetValue());
      } else if (cmHasLiteralPrefix(args.current->GetValue(),
                                    "CMAKE_MATCH_")) {
        // The string to match is owned by our match result variables.
        // Move it to our own buffer before clearing them.
        def_buf = *def;
        def = cmValue(def_buf);
      }

      this->Makefile.ClearMatches();

      const auto& rex = args.nextnext->GetValue();
      cmsys::RegularExpression regEntry;
      if (!regEntry.compile(rex)) {
        std::ostringstream error;
        error << "Regular expression \"" << rex << "\" cannot compile";
        errorString = error.str();
        status = MessageType::FATAL_ERROR;
        return false;
      }

      const auto match = regEntry.find(*def);
      if (match) {
        this->Makefile.StoreMatches(regEntry);
      }
      newArgs.ReduceTwoArgs(match, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyLESS, keyLESS_EQUAL, keyGREATER,
                                keyGREATER_EQUAL, keyEQUAL))) {

      cmValue ldef = this->GetVariableOrString(*args.current);
      cmValue rdef = this->GetVariableOrString(*args.nextnext);

      double lhs;
      double rhs;
      auto parseDoubles = [&]() {
        return std::sscanf(ldef->c_str(), "%lg", &lhs) == 1 &&
          std::sscanf(rdef->c_str(), "%lg", &rhs) == 1;
      };
      // clang-format off
      const auto result = parseDoubles() &&
        cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, lhs, rhs);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo = this->matchKeys(*args.next, keySTRLESS,
                                        keySTRLESS_EQUAL, keySTRGREATER,
                                        keySTRGREATER_EQUAL, keySTREQUAL))) {

      const cmValue lhs = this->GetVariableOrString(*args.current);
      const cmValue rhs = this->GetVariableOrString(*args.nextnext);
      const auto val = (*lhs).compare(*rhs);
      // clang-format off
      const auto result = cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, val, 0);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyVERSION_LESS,
                                keyVERSION_LESS_EQUAL, keyVERSION_GREATER,
                                keyVERSION_GREATER_EQUAL, keyVERSION_EQUAL))) {
      const auto op = MATCH2CMPOP[matchNo - 1];
      const std::string& lhs = this->GetVariableOrString(*args.current);
      const std::string& rhs = this->GetVariableOrString(*args.nextnext);
      const auto result = cmSystemTools::VersionCompare(op, lhs, rhs);
      newArgs.ReduceTwoArgs(result, args);
    }

    // is file A newer than file B
    else if (this->IsKeyword(keyIS_NEWER_THAN, *args.next)) {
      auto fileIsNewer = 0;
      cmsys::Status ftcStatus = cmSystemTools::FileTimeCompare(
        args.current->GetValue(), args.nextnext->GetValue(), &fileIsNewer);
      newArgs.ReduceTwoArgs(
        (!ftcStatus || fileIsNewer == 1 || fileIsNewer == 0), args);
    }

    else if (this->IsKeyword(keyIN_LIST, *args.next)) {

      if (this->Policy57Status != cmPolicies::OLD &&
          this->Policy57Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->Makefile.GetDefinition(args.nextnext->GetValue());

        newArgs.ReduceTwoArgs(
          rhs && cm::contains(cmExpandedList(*rhs, true), *lhs), args);
      }

      else if (this->Policy57Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057)
          << "\n"
             "IN_LIST will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }

    else if (this->IsKeyword(keyPATH_EQUAL, *args.next)) {

      if (this->Policy139Status != cmPolicies::OLD &&
          this->Policy139Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->GetVariableOrString(*args.nextnext);
        const auto result = cmCMakePath{ *lhs } == cmCMakePath{ *rhs };
        newArgs.ReduceTwoArgs(result, args);
      }

      else if (this->Policy139Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0139)
          << "\n"
             "PATH_EQUAL will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }
  }
  return true;
}